

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::AssignStmt::clone
          (AssignStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<kratos::Stmt> local_68 [2];
  enable_shared_from_this<kratos::Var> local_48;
  enable_shared_from_this<kratos::Var> local_38;
  undefined1 local_28 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  AssignStmt *this_local;
  
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_38);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_48);
  std::
  make_shared<kratos::AssignStmt,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>,kratos::AssignmentType_const&>
            ((shared_ptr<kratos::Var> *)local_28,(shared_ptr<kratos::Var> *)&local_38,
             (AssignmentType *)&local_48);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_48);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_38);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (local_68,(shared_ptr<kratos::AssignStmt> *)local_28);
  Stmt::copy_meta((Stmt *)__fn,local_68);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(local_68);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::AssignStmt> *)local_28);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> AssignStmt::clone() const {
    auto stmt = std::make_shared<AssignStmt>(left_->shared_from_this(), right_->shared_from_this(),
                                             assign_type_);
    copy_meta(stmt);
    return stmt;
}